

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O2

void __thiscall CEExecOptions::SetCorrFiles(CEExecOptions *this)

{
  size_type sVar1;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_50,"nutation",&local_51);
  CLOptions::AsString(&local_30,&this->super_CLOptions,&local_50);
  sVar1 = local_30._M_string_length;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (sVar1 != 0) {
    std::__cxx11::string::string((string *)&local_50,"nutation",&local_51);
    CLOptions::AsString(&local_30,&this->super_CLOptions,&local_50);
    CppEphem::SetNutationFile((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)&local_50,"ttut1hist",&local_51);
  CLOptions::AsString(&local_30,&this->super_CLOptions,&local_50);
  sVar1 = local_30._M_string_length;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (sVar1 != 0) {
    std::__cxx11::string::string((string *)&local_50,"ttut1hist",&local_51);
    CLOptions::AsString(&local_30,&this->super_CLOptions,&local_50);
    CppEphem::SetTtUt1HistFile((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)&local_50,"ttut1pred",&local_51);
  CLOptions::AsString(&local_30,&this->super_CLOptions,&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  if (local_30._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_50,"ttut1pred",&local_51);
    CLOptions::AsString(&local_30,&this->super_CLOptions,&local_50);
    CppEphem::SetTtUt1PredFile((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

inline 
void CEExecOptions::SetCorrFiles(void)
{
    // Nutation
    if (AsString("nutation").size() > 0) {
        CppEphem::SetNutationFile(AsString("nutation"));
    }
    // TT - UT1 (historical)
    if (AsString("ttut1hist").size() > 0) {
        CppEphem::SetTtUt1HistFile(AsString("ttut1hist"));
    }
    // TT - UT1 (predictions)
    if (AsString("ttut1pred").size() > 0) {
        CppEphem::SetTtUt1PredFile(AsString("ttut1pred"));
    }
}